

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O3

void lj_err_optype_call(lua_State *L,TValue *o)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  
  uVar1 = *(ulong *)(((ulong)L->cframe & 0xfffffffffffffffc) + 0x18);
  if ((uVar1 & 3) == 0) {
    lj_err_optype(L,o,LJ_ERR_OPCALL);
  }
  uVar3 = 0xd;
  if (0xfffffffffffffff2 < (ulong)(o->it64 >> 0x2f)) {
    uVar3 = ~(o->it64 >> 0x2f);
  }
  pcVar2 = lj_obj_itypename[uVar3];
  o->u64 = (ulong)L | 0xfffc800000000000;
  o[1].u64 = uVar1;
  L->base = o + 2;
  L->top = o + 2;
  err_msgv(L,LJ_ERR_BADCALL,pcVar2);
}

Assistant:

LJ_NOINLINE void lj_err_optype_call(lua_State *L, TValue *o)
{
  /* Gross hack if lua_[p]call or pcall/xpcall fail for a non-callable object:
  ** L->base still points to the caller. So add a dummy frame with L instead
  ** of a function. See lua_getstack().
  */
  const BCIns *pc = cframe_Lpc(L);
  if (((ptrdiff_t)pc & FRAME_TYPE) != FRAME_LUA) {
    const char *tname = lj_typename(o);
    setframe_gc(o, obj2gco(L), LJ_TTHREAD);
    if (LJ_FR2) o++;
    setframe_pc(o, pc);
    L->top = L->base = o+1;
    err_msgv(L, LJ_ERR_BADCALL, tname);
  }
  lj_err_optype(L, o, LJ_ERR_OPCALL);
}